

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::ISOYearOperator>(date_t input)

{
  bool bVar1;
  date_t date;
  int32_t iVar2;
  undefined1 auVar3 [12];
  date_t result;
  date_t local_3c;
  string local_38;
  
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    date = Date::GetMondayOfCurrentWeek(input);
    iVar2 = Date::ExtractISOWeekNumber(date);
    local_3c.days = iVar2 * -7 + date.days + 7;
  }
  else {
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(input,&local_3c,false);
    if (!bVar1) {
      auVar3 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_38,(duckdb *)(ulong)(uint)input.days,(date_t)auVar3._8_4_);
      InvalidInputException::InvalidInputException(auVar3._0_8_,&local_38);
      __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (date_t)local_3c.days;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}